

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O3

void wall_extends(level *lev,int x1,int y1,int x2,int y2)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  undefined4 in_register_00000084;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  byte bVar15;
  ulong uVar16;
  byte local_8c;
  byte local_88;
  byte local_84;
  
  if ((((0x4f < x2 || x1 < 0) || (y2 < y1)) || (y1 < 0)) || ((x2 < x1 || (0x14 < y2)))) {
    panic("wall_extends: bad bounds (%d,%d) to (%d,%d)",(ulong)(uint)x1,(ulong)(uint)y1,
          (ulong)(uint)x2,CONCAT44(in_register_00000084,y2));
  }
  if (x1 <= x2) {
    uVar16 = (ulong)x1;
    do {
      if (y1 <= y2) {
        uVar1 = uVar16 - 1;
        uVar14 = (int)uVar16 - 2;
        lVar6 = uVar1 * 0xfc;
        uVar5 = (long)y1;
        do {
          if ((byte)(lev->locations[uVar16][uVar5].typ - 1U) < 0xb) {
            uVar2 = uVar5 - 1;
            if ((uVar2 < 0x15 && uVar14 < 0x4f) &&
               (bVar13 = *(byte *)((long)lev + uVar2 * 0xc + lVar6 + 0x44), '\f' < (char)bVar13)) {
              local_84 = 1;
              if (bVar13 < 0x18) {
                local_84 = (byte)(0x3f7fff >> (bVar13 & 0x1f));
              }
            }
            else {
              local_84 = 0;
            }
            if ((0x4e < uVar1 || 0x14 < uVar2) ||
               (bVar13 = lev->locations[uVar16 - 1][uVar5 + 0x14].typ, (char)bVar13 < '\r')) {
              bVar12 = 0;
            }
            else {
              bVar12 = 1;
              if (bVar13 < 0x18) {
                bVar12 = (byte)(0x3f7fff >> (bVar13 & 0x1f));
              }
            }
            if ((uVar16 < 0x4f && uVar2 < 0x15) &&
               (bVar13 = lev->locations[uVar16][uVar5 + 0x14].typ, '\f' < (char)bVar13)) {
              bVar10 = 1;
              if (bVar13 < 0x18) {
                bVar10 = (byte)(0x3f7fff >> (bVar13 & 0x1f));
              }
            }
            else {
              bVar10 = 0;
            }
            if ((0x14 < uVar5 || 0x4e < uVar14) ||
               (bVar13 = *(byte *)((long)lev + uVar5 * 0xc + lVar6 + 0x44), (char)bVar13 < '\r')) {
              bVar15 = 0;
            }
            else {
              bVar15 = 1;
              if (bVar13 < 0x18) {
                bVar15 = (byte)(0x3f7fff >> (bVar13 & 0x1f));
              }
            }
            if ((0x4e < uVar16 || 0x14 < uVar5) ||
               (bVar13 = lev->locations[uVar16 + 1][uVar5].typ, (char)bVar13 < '\r')) {
              local_88 = 0;
            }
            else {
              local_88 = 1;
              if (bVar13 < 0x18) {
                local_88 = (byte)(0x3f7fff >> (bVar13 & 0x1f));
              }
            }
            uVar4 = (uint)(uVar5 + 1);
            bVar13 = 0;
            if ((uVar14 < 0x4f) && (bVar13 = 0, uVar4 < 0x15)) {
              bVar8 = *(byte *)((long)lev + (uVar5 + 1) * 0xc + lVar6 + 0x44);
              if ((char)bVar8 < '\r') {
                bVar13 = 0;
              }
              else {
                bVar13 = 1;
                if (bVar8 < 0x18) {
                  bVar13 = (byte)(0x3f7fff >> (bVar8 & 0x1f));
                }
              }
            }
            if ((0x4e < uVar1 || 0x14 < uVar4) ||
               (bVar8 = lev->locations[uVar16][uVar5 + 1].typ, (char)bVar8 < '\r')) {
              local_8c = 0;
            }
            else {
              local_8c = 1;
              if (bVar8 < 0x18) {
                local_8c = (byte)(0x3f7fff >> (bVar8 & 0x1f));
              }
            }
            if (uVar16 < 0x4f) {
              bVar8 = 0;
              if (uVar4 < 0x15) {
                bVar3 = lev->locations[uVar16 + 1][uVar5 + 1].typ;
                if ((char)bVar3 < '\r') goto LAB_001dd8c8;
                bVar8 = 1;
                if (bVar3 < 0x18) {
                  bVar8 = (byte)(0x3f7fff >> (bVar3 & 0x1f));
                }
              }
            }
            else {
LAB_001dd8c8:
              bVar8 = 0;
            }
            uVar9 = 0;
            if ((0x4e >= uVar1 && 0x14 >= uVar2) &&
               ((bVar3 = lev->locations[uVar16 - 1][uVar5 + 0x14].typ,
                bVar3 != 0 && (char)bVar3 < '\r' ||
                ((uVar9 = 0, bVar3 < 0x18 && ((0xc08000U >> (bVar3 & 0x1f) & 1) != 0)))))) {
              uVar9 = ((byte)(bVar10 | local_84 | bVar15 | local_88) & 1) << 3;
            }
            uVar7 = 0;
            if (0x4e >= uVar1 && 0x14 >= uVar4) {
              bVar3 = lev->locations[uVar16][uVar5 + 1].typ;
              if (bVar3 == 0 || '\f' < (char)bVar3) {
                uVar7 = 0;
                if ((0x17 < bVar3) || (uVar7 = 0, (0xc08000U >> (bVar3 & 0x1f) & 1) == 0))
                goto LAB_001dd972;
              }
              uVar7 = ((byte)(bVar13 | bVar8 | bVar15 | local_88) & 1) << 2;
            }
LAB_001dd972:
            uVar4 = 0;
            if ((0x4e >= uVar16 && 0x14 >= uVar5) &&
               ((bVar15 = lev->locations[uVar16 + 1][uVar5].typ, bVar15 != 0 && (char)bVar15 < '\r'
                || ((uVar4 = 0, bVar15 < 0x18 &&
                    (uVar4 = 0, (0xc08000U >> (bVar15 & 0x1f) & 1) != 0)))))) {
              uVar4 = ((byte)(bVar10 | bVar8 | bVar12 | local_8c) & 1) * 2;
            }
            uVar11 = 0;
            if ((0x14 >= uVar5 && 0x4e >= uVar14) &&
               ((bVar10 = *(byte *)((long)lev + uVar5 * 0xc + lVar6 + 0x44),
                bVar10 != 0 && (char)bVar10 < '\r' ||
                ((uVar11 = 0, bVar10 < 0x18 && ((0xc08000U >> (bVar10 & 0x1f) & 1) != 0)))))) {
              uVar11 = (byte)(bVar13 | local_84 | bVar12 | local_8c) & 1;
            }
            uVar11 = uVar7 | uVar9 | uVar4 | uVar11;
            if (uVar11 != 0) {
              lev->locations[uVar16][uVar5].typ =
                   "\x01\x02\x02\x02\x01\x04\x03\t\x01\x06\x05\b\x01\n\v\a"[uVar11];
            }
          }
          uVar5 = uVar5 + 1;
        } while ((int)uVar5 != y2 + 1);
      }
      uVar16 = uVar16 + 1;
    } while (x2 + 1 != (int)uVar16);
  }
  return;
}

Assistant:

void wall_extends(struct level *lev, int x1, int y1, int x2, int y2)
{
	uchar type;
	int x, y;
	struct rm *loc;
	int bits;
	int locale[3][3];	/* rock or wall status surrounding positions */
	/*
	 * Value 0 represents a free-standing wall.  It could be anything,
	 * so even though this table says VWALL, we actually leave whatever
	 * typ was there alone.
	 */
	static const xchar spine_array[16] = {
	    VWALL,	HWALL,		HWALL,		HWALL,
	    VWALL,	TRCORNER,	TLCORNER,	TDWALL,
	    VWALL,	BRCORNER,	BLCORNER,	TUWALL,
	    VWALL,	TLWALL,		TRWALL,		CROSSWALL
	};

	/* sanity check on incoming variables */
	if (x1 < 0 || x2 >= COLNO || x1 > x2 || y1 < 0 || y2 >= ROWNO || y1 > y2)
	    panic("wall_extends: bad bounds (%d,%d) to (%d,%d)", x1, y1, x2, y2);

	for (x = x1; x <= x2; x++)
	    for (y = y1; y <= y2; y++) {
		loc = &lev->locations[x][y];
		type = loc->typ;
		if ( !(IS_WALL(type) && type != DBWALL)) continue;

		/* set the locations TRUE if rock or wall or out of bounds */
		locale[0][0] = iswall_or_stone(lev, x-1, y-1);
		locale[1][0] = iswall_or_stone(lev,   x, y-1);
		locale[2][0] = iswall_or_stone(lev, x+1, y-1);

		locale[0][1] = iswall_or_stone(lev, x-1,   y);
		locale[2][1] = iswall_or_stone(lev, x+1,   y);

		locale[0][2] = iswall_or_stone(lev, x-1, y+1);
		locale[1][2] = iswall_or_stone(lev,   x, y+1);
		locale[2][2] = iswall_or_stone(lev, x+1, y+1);

		/* determine if wall should extend to each direction NSEW */
		bits =    (extend_spine(locale, iswall(lev, x,y-1),  0, -1) << 3)
			| (extend_spine(locale, iswall(lev, x,y+1),  0,  1) << 2)
			| (extend_spine(locale, iswall(lev, x+1,y),  1,  0) << 1)
			|  extend_spine(locale, iswall(lev, x-1,y), -1,  0);

		/* don't change typ if wall is free-standing */
		if (bits) loc->typ = spine_array[bits];
	    }
}